

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

uint64_t __thiscall
mkvmuxer::Segment::AddAudioTrack(Segment *this,int32_t sample_rate,int32_t channels,int32_t number)

{
  bool bVar1;
  AudioTrack *this_00;
  AudioTrack *local_50;
  AudioTrack *track;
  int32_t number_local;
  int32_t channels_local;
  int32_t sample_rate_local;
  Segment *this_local;
  
  this_00 = (AudioTrack *)operator_new(0x90,(nothrow_t *)&std::nothrow);
  local_50 = (AudioTrack *)0x0;
  if (this_00 != (AudioTrack *)0x0) {
    AudioTrack::AudioTrack(this_00,&this->seed_);
    local_50 = this_00;
  }
  if (local_50 == (AudioTrack *)0x0) {
    this_local = (Segment *)0x0;
  }
  else {
    Track::set_type(&local_50->super_Track,2);
    Track::set_codec_id(&local_50->super_Track,"A_VORBIS");
    AudioTrack::set_sample_rate(local_50,(double)sample_rate);
    AudioTrack::set_channels(local_50,(long)channels);
    bVar1 = Tracks::AddTrack(&this->tracks_,&local_50->super_Track,number);
    if (bVar1) {
      this_local = (Segment *)Track::number(&local_50->super_Track);
    }
    else {
      if (local_50 != (AudioTrack *)0x0) {
        (*(local_50->super_Track)._vptr_Track[1])();
      }
      this_local = (Segment *)0x0;
    }
  }
  return (uint64_t)this_local;
}

Assistant:

uint64_t Segment::AddAudioTrack(int32_t sample_rate, int32_t channels,
                                int32_t number) {
  AudioTrack* const track = new (std::nothrow) AudioTrack(&seed_);  // NOLINT
  if (!track)
    return 0;

  track->set_type(Tracks::kAudio);
  track->set_codec_id(Tracks::kVorbisCodecId);
  track->set_sample_rate(sample_rate);
  track->set_channels(channels);

  if (!tracks_.AddTrack(track, number)) {
    delete track;
    return 0;
  }

  return track->number();
}